

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_keyword(yang_token keyword,yang_arg arg,FILE *out,int level,FILE *in,char **buf,
                 int *buf_len)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_50;
  char *close_tag;
  char *yin_element;
  char *word;
  char **buf_local;
  FILE *in_local;
  int level_local;
  FILE *out_local;
  yang_token local_10;
  yang_arg arg_local;
  yang_token keyword_local;
  
  pFVar1 = _stderr;
  close_tag = (char *)0x0;
  out_local._4_4_ = arg;
  local_10 = keyword;
  switch(keyword) {
  case YANG_ANYXML:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<anyxml name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "anyxml";
    break;
  case YANG_ARGUMENT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<argument name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "argument";
    break;
  case YANG_AUGMENT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<augment target-node=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "augment";
    break;
  case YANG_BASE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<base name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "base";
    break;
  case YANG_BELONGS_TO:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<belongs-to module=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "belongs-to";
    break;
  case YANG_BIT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<bit name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "bit";
    break;
  case YANG_CASE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<case name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "case";
    break;
  case YANG_CHOICE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<choice name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "choice";
    break;
  case YANG_CONFIG:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<config value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "config";
    break;
  case YANG_CONTACT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<contact>\n",(ulong)(uint)(level << 1),pcVar3);
    close_tag = "text";
    local_50 = "contact";
    break;
  case YANG_CONTAINER:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<container name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "container";
    break;
  case YANG_DEFAULT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<default value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "default";
    break;
  case YANG_DESCRIPTION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<description>\n",(ulong)(uint)(level << 1),pcVar3);
    close_tag = "text";
    local_50 = "description";
    break;
  case YANG_DEVIATE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<deviate value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "deviate";
    break;
  case YANG_DEVIATION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<deviation target-node=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "deviation";
    break;
  case YANG_ENUM:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<enum name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "enum";
    break;
  case YANG_ERROR_APP_TAG:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<error-app-tag value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "error-app-tag";
    break;
  case YANG_ERROR_MESSAGE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<error-message>\n",(ulong)(uint)(level << 1),pcVar3);
    close_tag = "value";
    local_50 = "error-message";
    break;
  case YANG_EXTENSION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<extension name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "extension";
    break;
  case YANG_FEATURE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<feature name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "feature";
    break;
  case YANG_FRACTION_DIGITS:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<fraction-digits value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "fraction-digits";
    break;
  case YANG_GROUPING:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<grouping name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "grouping";
    break;
  case YANG_IDENTITY:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<identity name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "identity";
    break;
  case YANG_IF_FEATURE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<if-feature name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "if-feature";
    break;
  case YANG_IMPORT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<import module=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "import";
    break;
  case YANG_INCLUDE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<include module=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "include";
    break;
  case YANG_INPUT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<input",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "input";
    break;
  case YANG_KEY:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<key value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "key";
    break;
  case YANG_LEAF:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<leaf name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "leaf";
    break;
  case YANG_LEAF_LIST:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<leaf-list name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "leaf-list";
    break;
  case YANG_LENGTH:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<length value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "length";
    break;
  case YANG_LIST:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<list name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "list";
    break;
  case YANG_MANDATORY:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<mandatory value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "mandatory";
    break;
  case YANG_MAX_ELEMENTS:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<max-elements value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "max-elements";
    break;
  case YANG_MIN_ELEMENTS:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<min-elements value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "min-elements";
    break;
  default:
    pcVar3 = keyword2str(keyword);
    fprintf(pFVar1,"Unexpected keyword \"%s\".\n",pcVar3);
    return -1;
  case YANG_MUST:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<must condition=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "must";
    break;
  case YANG_NAMESPACE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<namespace uri=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "namespace";
    break;
  case YANG_NOTIFICATION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<notification name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "notification";
    break;
  case YANG_ORDERED_BY:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<ordered-by value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "ordered-by";
    break;
  case YANG_ORGANIZATION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<organization>\n",(ulong)(uint)(level << 1),pcVar3);
    close_tag = "text";
    local_50 = "organization";
    break;
  case YANG_OUTPUT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<output",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "output";
    break;
  case YANG_PATH:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<path value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "path";
    break;
  case YANG_PATTERN:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<pattern value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "pattern";
    break;
  case YANG_POSITION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<position value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "value";
    break;
  case YANG_PREFIX:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<prefix value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "prefix";
    break;
  case YANG_PRESENCE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<presence value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "presence";
    break;
  case YANG_RANGE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<range value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "range";
    break;
  case YANG_REFERENCE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<reference>\n",(ulong)(uint)(level << 1),pcVar3);
    close_tag = "text";
    local_50 = "reference";
    break;
  case YANG_REFINE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<refine target-node=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "refine";
    break;
  case YANG_REQUIRE_INSTANCE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<require-instance value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "require-instance";
    break;
  case YANG_REVISION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<revision date=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "revision";
    break;
  case YANG_REVISION_DATE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<revision-date date=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "revision-date";
    break;
  case YANG_RPC:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<rpc name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "rpc";
    break;
  case YANG_STATUS:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<status value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "status";
    break;
  case YANG_TYPE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<type name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "type";
    break;
  case YANG_TYPEDEF:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<typedef name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "typedef";
    break;
  case YANG_UNIQUE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<unique tag=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "unique";
    break;
  case YANG_UNITS:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<units name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "units";
    break;
  case YANG_USES:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<uses name=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "uses";
    break;
  case YANG_VALUE:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<value value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "value";
    break;
  case YANG_WHEN:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<when condition=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "condition";
    break;
  case YANG_YANG_VERSION:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<yang-version value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "yang-version";
    break;
  case YANG_YIN_ELEMENT:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<yin-element value=\"",(ulong)(uint)(level << 1),pcVar3);
    local_50 = "yin-element";
    break;
  case YANG_CUSTOM:
    pcVar3 = "";
    if (level != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<%s",(ulong)(uint)(level << 1),pcVar3,*buf);
    local_50 = "!!error!!";
  }
  in_local._4_4_ = level;
  if (close_tag != (char *)0x0) {
    in_local._4_4_ = level + 1;
    pcVar3 = "";
    if (in_local._4_4_ != 0) {
      pcVar3 = " ";
    }
    fprintf((FILE *)out,"%*s<%s>",(ulong)(uint)(in_local._4_4_ * 2),pcVar3,close_tag);
  }
  if (out_local._4_4_ != Y_NO_ARG) {
    if (out_local._4_4_ == Y_IDENTIF_ARG) {
      pcVar3 = get_word(in,buf,buf_len);
      if (pcVar3 == (char *)0x0) {
        return -1;
      }
      pcVar4 = "\"";
      if (close_tag != (char *)0x0) {
        pcVar4 = "";
      }
      fprintf((FILE *)out,"%s%s",pcVar3,pcVar4);
    }
    else if (out_local._4_4_ == Y_STR_ARG) {
      pcVar3 = get_word(in,buf,buf_len);
      if (pcVar3 == (char *)0x0) {
        return -1;
      }
      if (close_tag == (char *)0x0) {
        print_attr_val_xml_encode(out,pcVar3);
        fprintf((FILE *)out,"\"");
      }
      else {
        print_text_xml_encode(out,pcVar3);
      }
    }
  }
  if (close_tag != (char *)0x0) {
    fprintf((FILE *)out,"</%s>\n",close_tag);
    in_local._4_4_ = in_local._4_4_ + -1;
  }
  pcVar3 = get_word(in,buf,buf_len);
  if (pcVar3 == (char *)0x0) {
    arg_local = ~Y_NO_ARG;
  }
  else {
    local_10 = get_keyword(pcVar3,(yang_arg *)((long)&out_local + 4));
    if (local_10 == YANG_UNKNOWN) {
      fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar3);
      arg_local = ~Y_NO_ARG;
    }
    else if (local_10 == YANG_LEFT_BRACE) {
      if (close_tag == (char *)0x0) {
        fprintf((FILE *)out,">\n");
      }
      do {
        pcVar3 = get_word(in,buf,buf_len);
        if (pcVar3 == (char *)0x0) {
          return -1;
        }
        local_10 = get_keyword(pcVar3,(yang_arg *)((long)&out_local + 4));
        if (local_10 == YANG_UNKNOWN) {
          fprintf(_stderr,"Unexpected characters (\"%.20s\"...).\n",pcVar3);
          return -1;
        }
        if (local_10 == YANG_RIGHT_BRACE) {
          pcVar3 = "";
          if (in_local._4_4_ != 0) {
            pcVar3 = " ";
          }
          fprintf((FILE *)out,"%*s</%s>\n",(ulong)(uint)(in_local._4_4_ << 1),pcVar3,local_50);
          goto LAB_00105999;
        }
        iVar2 = print_keyword(local_10,out_local._4_4_,out,in_local._4_4_ + 1,in,buf,buf_len);
      } while (iVar2 == 0);
      arg_local = ~Y_NO_ARG;
    }
    else {
LAB_00105999:
      pFVar1 = _stderr;
      if ((local_10 == YANG_SEMICOLON) || (local_10 == YANG_RIGHT_BRACE)) {
        if (local_10 == YANG_SEMICOLON) {
          if (close_tag == (char *)0x0) {
            fprintf((FILE *)out,"/>\n");
          }
          else {
            pcVar3 = "";
            if (in_local._4_4_ != 0) {
              pcVar3 = " ";
            }
            fprintf((FILE *)out,"%*s</%s>\n",(ulong)(uint)(in_local._4_4_ << 1),pcVar3,local_50);
          }
        }
        arg_local = Y_NO_ARG;
      }
      else {
        pcVar3 = keyword2str(local_10);
        fprintf(pFVar1,"Unexpected keyword \"%s\".\n",pcVar3);
        arg_local = ~Y_NO_ARG;
      }
    }
  }
  return arg_local;
}

Assistant:

static int
print_keyword(enum yang_token keyword, enum yang_arg arg, FILE *out, int level, FILE *in, char **buf, int *buf_len)
{
    char *word;
    const char *yin_element = NULL, *close_tag;

    switch (keyword) {
    case YANG_ANYXML:
        fprintf(out, "%*s<anyxml name=\"", LEVEL(level), INDENT(level));
        close_tag = "anyxml";
        break;
    case YANG_ARGUMENT:
        fprintf(out, "%*s<argument name=\"", LEVEL(level), INDENT(level));
        close_tag = "argument";
        break;
    case YANG_AUGMENT:
        fprintf(out, "%*s<augment target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "augment";
        break;
    case YANG_BASE:
        fprintf(out, "%*s<base name=\"", LEVEL(level), INDENT(level));
        close_tag = "base";
        break;
    case YANG_BELONGS_TO:
        fprintf(out, "%*s<belongs-to module=\"", LEVEL(level), INDENT(level));
        close_tag = "belongs-to";
        break;
    case YANG_BIT:
        fprintf(out, "%*s<bit name=\"", LEVEL(level), INDENT(level));
        close_tag = "bit";
        break;
    case YANG_CASE:
        fprintf(out, "%*s<case name=\"", LEVEL(level), INDENT(level));
        close_tag = "case";
        break;
    case YANG_CHOICE:
        fprintf(out, "%*s<choice name=\"", LEVEL(level), INDENT(level));
        close_tag = "choice";
        break;
    case YANG_CONFIG:
        fprintf(out, "%*s<config value=\"", LEVEL(level), INDENT(level));
        close_tag = "config";
        break;
    case YANG_CONTACT:
        fprintf(out, "%*s<contact>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "contact";
        break;
    case YANG_CONTAINER:
        fprintf(out, "%*s<container name=\"", LEVEL(level), INDENT(level));
        close_tag = "container";
        break;
    case YANG_DEFAULT:
        fprintf(out, "%*s<default value=\"", LEVEL(level), INDENT(level));
        close_tag = "default";
        break;
    case YANG_DESCRIPTION:
        fprintf(out, "%*s<description>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "description";
        break;
    case YANG_DEVIATE:
        fprintf(out, "%*s<deviate value=\"", LEVEL(level), INDENT(level));
        close_tag = "deviate";
        break;
    case YANG_DEVIATION:
        fprintf(out, "%*s<deviation target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "deviation";
        break;
    case YANG_ENUM:
        fprintf(out, "%*s<enum name=\"", LEVEL(level), INDENT(level));
        close_tag = "enum";
        break;
    case YANG_ERROR_APP_TAG:
        fprintf(out, "%*s<error-app-tag value=\"", LEVEL(level), INDENT(level));
        close_tag = "error-app-tag";
        break;
    case YANG_ERROR_MESSAGE:
        fprintf(out, "%*s<error-message>\n", LEVEL(level), INDENT(level));
        yin_element = "value";
        close_tag = "error-message";
        break;
    case YANG_EXTENSION:
        fprintf(out, "%*s<extension name=\"", LEVEL(level), INDENT(level));
        close_tag = "extension";
        break;
    case YANG_FEATURE:
        fprintf(out, "%*s<feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "feature";
        break;
    case YANG_FRACTION_DIGITS:
        fprintf(out, "%*s<fraction-digits value=\"", LEVEL(level), INDENT(level));
        close_tag = "fraction-digits";
        break;
    case YANG_GROUPING:
        fprintf(out, "%*s<grouping name=\"", LEVEL(level), INDENT(level));
        close_tag = "grouping";
        break;
    case YANG_IDENTITY:
        fprintf(out, "%*s<identity name=\"", LEVEL(level), INDENT(level));
        close_tag = "identity";
        break;
    case YANG_IF_FEATURE:
        fprintf(out, "%*s<if-feature name=\"", LEVEL(level), INDENT(level));
        close_tag = "if-feature";
        break;
    case YANG_IMPORT:
        fprintf(out, "%*s<import module=\"", LEVEL(level), INDENT(level));
        close_tag = "import";
        break;
    case YANG_INCLUDE:
        fprintf(out, "%*s<include module=\"", LEVEL(level), INDENT(level));
        close_tag = "include";
        break;
    case YANG_INPUT:
        fprintf(out, "%*s<input", LEVEL(level), INDENT(level));
        close_tag = "input";
        break;
    case YANG_KEY:
        fprintf(out, "%*s<key value=\"", LEVEL(level), INDENT(level));
        close_tag = "key";
        break;
    case YANG_LEAF:
        fprintf(out, "%*s<leaf name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf";
        break;
    case YANG_LEAF_LIST:
        fprintf(out, "%*s<leaf-list name=\"", LEVEL(level), INDENT(level));
        close_tag = "leaf-list";
        break;
    case YANG_LENGTH:
        fprintf(out, "%*s<length value=\"", LEVEL(level), INDENT(level));
        close_tag = "length";
        break;
    case YANG_LIST:
        fprintf(out, "%*s<list name=\"", LEVEL(level), INDENT(level));
        close_tag = "list";
        break;
    case YANG_MANDATORY:
        fprintf(out, "%*s<mandatory value=\"", LEVEL(level), INDENT(level));
        close_tag = "mandatory";
        break;
    case YANG_MAX_ELEMENTS:
        fprintf(out, "%*s<max-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "max-elements";
        break;
    case YANG_MIN_ELEMENTS:
        fprintf(out, "%*s<min-elements value=\"", LEVEL(level), INDENT(level));
        close_tag = "min-elements";
        break;
    case YANG_MUST:
        fprintf(out, "%*s<must condition=\"", LEVEL(level), INDENT(level));
        close_tag = "must";
        break;
    case YANG_NAMESPACE:
        fprintf(out, "%*s<namespace uri=\"", LEVEL(level), INDENT(level));
        close_tag = "namespace";
        break;
    case YANG_NOTIFICATION:
        fprintf(out, "%*s<notification name=\"", LEVEL(level), INDENT(level));
        close_tag = "notification";
        break;
    case YANG_ORDERED_BY:
        fprintf(out, "%*s<ordered-by value=\"", LEVEL(level), INDENT(level));
        close_tag = "ordered-by";
        break;
    case YANG_ORGANIZATION:
        fprintf(out, "%*s<organization>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "organization";
        break;
    case YANG_OUTPUT:
        fprintf(out, "%*s<output", LEVEL(level), INDENT(level));
        close_tag = "output";
        break;
    case YANG_PATH:
        fprintf(out, "%*s<path value=\"", LEVEL(level), INDENT(level));
        close_tag = "path";
        break;
    case YANG_PATTERN:
        fprintf(out, "%*s<pattern value=\"", LEVEL(level), INDENT(level));
        close_tag = "pattern";
        break;
    case YANG_POSITION:
        fprintf(out, "%*s<position value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_PREFIX:
        fprintf(out, "%*s<prefix value=\"", LEVEL(level), INDENT(level));
        close_tag = "prefix";
        break;
    case YANG_PRESENCE:
        fprintf(out, "%*s<presence value=\"", LEVEL(level), INDENT(level));
        close_tag = "presence";
        break;
    case YANG_RANGE:
        fprintf(out, "%*s<range value=\"", LEVEL(level), INDENT(level));
        close_tag = "range";
        break;
    case YANG_REFERENCE:
        fprintf(out, "%*s<reference>\n", LEVEL(level), INDENT(level));
        yin_element = "text";
        close_tag = "reference";
        break;
    case YANG_REFINE:
        fprintf(out, "%*s<refine target-node=\"", LEVEL(level), INDENT(level));
        close_tag = "refine";
        break;
    case YANG_REQUIRE_INSTANCE:
        fprintf(out, "%*s<require-instance value=\"", LEVEL(level), INDENT(level));
        close_tag = "require-instance";
        break;
    case YANG_REVISION:
        fprintf(out, "%*s<revision date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision";
        break;
    case YANG_REVISION_DATE:
        fprintf(out, "%*s<revision-date date=\"", LEVEL(level), INDENT(level));
        close_tag = "revision-date";
        break;
    case YANG_RPC:
        fprintf(out, "%*s<rpc name=\"", LEVEL(level), INDENT(level));
        close_tag = "rpc";
        break;
    case YANG_STATUS:
        fprintf(out, "%*s<status value=\"", LEVEL(level), INDENT(level));
        close_tag = "status";
        break;
    case YANG_TYPE:
        fprintf(out, "%*s<type name=\"", LEVEL(level), INDENT(level));
        close_tag = "type";
        break;
    case YANG_TYPEDEF:
        fprintf(out, "%*s<typedef name=\"", LEVEL(level), INDENT(level));
        close_tag = "typedef";
        break;
    case YANG_UNIQUE:
        fprintf(out, "%*s<unique tag=\"", LEVEL(level), INDENT(level));
        close_tag = "unique";
        break;
    case YANG_UNITS:
        fprintf(out, "%*s<units name=\"", LEVEL(level), INDENT(level));
        close_tag = "units";
        break;
    case YANG_USES:
        fprintf(out, "%*s<uses name=\"", LEVEL(level), INDENT(level));
        close_tag = "uses";
        break;
    case YANG_VALUE:
        fprintf(out, "%*s<value value=\"", LEVEL(level), INDENT(level));
        close_tag = "value";
        break;
    case YANG_WHEN:
        fprintf(out, "%*s<when condition=\"", LEVEL(level), INDENT(level));
        close_tag = "condition";
        break;
    case YANG_YANG_VERSION:
        fprintf(out, "%*s<yang-version value=\"", LEVEL(level), INDENT(level));
        close_tag = "yang-version";
        break;
    case YANG_YIN_ELEMENT:
        fprintf(out, "%*s<yin-element value=\"", LEVEL(level), INDENT(level));
        close_tag = "yin-element";
        break;
    case YANG_CUSTOM:
        /* it must still be stored in buf */
        fprintf(out, "%*s<%s", LEVEL(level), INDENT(level), *buf);
        /* will be printed in case of some nested extension elements, we don't support that */
        close_tag = "!!error!!";
        break;
    default:
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }

    /* keyword followed by a child element */
    if (yin_element) {
        ++level;
        fprintf(out, "%*s<%s>", LEVEL(level), INDENT(level), yin_element);
    }

    /* keyword argument */
    switch (arg) {
    case Y_IDENTIF_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }

        /* word is the identifier (after some changes) */
        fprintf(out, "%s%s", word, (yin_element ? "" : "\""));
        break;

    case Y_STR_ARG:
        word = get_word(in, buf, buf_len);
        if (!word) {
            return -1;
        }
        /* word is the string */
        if (yin_element) {
            print_text_xml_encode(out, word);
        } else {
            print_attr_val_xml_encode(out, word);
        }

        if (!yin_element) {
            fprintf(out, "\"");
        }
        break;

    case Y_NO_ARG:
        break;
    }

    if (yin_element) {
        fprintf(out, "</%s>\n", yin_element);
        --level;
    }

    word = get_word(in, buf, buf_len);
    if (!word) {
        return -1;
    }
    keyword = get_keyword(word, &arg);
    if (!keyword) {
        fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
        return -1;
    }

    if (keyword == YANG_LEFT_BRACE) {
        if (!yin_element) {
            fprintf(out, ">\n");
        }

        while (1) {
            word = get_word(in, buf, buf_len);
            if (!word) {
                return -1;
            }
            keyword = get_keyword(word, &arg);
            if (!keyword) {
                fprintf(stderr, "Unexpected characters (\"%.20s\"...).\n", word);
                return -1;
            }

            if (keyword == YANG_RIGHT_BRACE) {
                break;
            }

            if (print_keyword(keyword, arg, out, level + 1, in, buf, buf_len)) {
                return -1;
            }
        }

        fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
    }
    if ((keyword != YANG_SEMICOLON) && (keyword != YANG_RIGHT_BRACE)) {
        fprintf(stderr, "Unexpected keyword \"%s\".\n", keyword2str(keyword));
        return -1;
    }
    if (keyword == YANG_SEMICOLON) {
        if (yin_element) {
            fprintf(out, "%*s</%s>\n", LEVEL(level), INDENT(level), close_tag);
        } else {
            fprintf(out, "/>\n");
        }
    }

    return 0;
}